

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokFilterMethod(sqlite3_vtab_cursor *pCursor,int idxNum,char *idxStr,int nVal,
                       sqlite3_value **apVal)

{
  sqlite3_vtab *psVar1;
  int n;
  uchar *__src;
  sqlite3_vtab *psVar2;
  int in_ESI;
  sqlite3_vtab_cursor *in_RDI;
  int nByte;
  char *zByte;
  Fts3tokTable *pTab;
  Fts3tokCursor *pCsr;
  int rc;
  Fts3tokCursor *in_stack_ffffffffffffffb0;
  int local_34;
  int local_4;
  
  local_34 = 1;
  psVar1 = in_RDI->pVtab;
  fts3tokResetCursor(in_stack_ffffffffffffffb0);
  if (in_ESI == 1) {
    __src = sqlite3_value_text((sqlite3_value *)0x1d14fc);
    n = sqlite3_value_bytes((sqlite3_value *)0x1d150e);
    psVar2 = (sqlite3_vtab *)sqlite3_malloc(n);
    in_RDI[1].pVtab = psVar2;
    if (in_RDI[1].pVtab == (sqlite3_vtab *)0x0) {
      local_34 = 7;
    }
    else {
      memcpy(in_RDI[1].pVtab,__src,(long)n);
      *(undefined1 *)((long)&(in_RDI[1].pVtab)->pModule + (long)n) = 0;
      local_34 = (*(psVar1[1].pModule)->xBestIndex)
                           (*(sqlite3_vtab **)&psVar1[1].nRef,(sqlite3_index_info *)in_RDI[1].pVtab)
      ;
      if (local_34 == 0) {
        (in_RDI[2].pVtab)->pModule = *(sqlite3_module **)&psVar1[1].nRef;
      }
    }
  }
  if (local_34 == 0) {
    local_4 = fts3tokNextMethod(in_RDI);
  }
  else {
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static int fts3tokFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *idxStr,             /* Unused */
  int nVal,                       /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  int rc = SQLITE_ERROR;
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;
  Fts3tokTable *pTab = (Fts3tokTable *)(pCursor->pVtab);
  UNUSED_PARAMETER(idxStr);
  UNUSED_PARAMETER(nVal);

  fts3tokResetCursor(pCsr);
  if( idxNum==1 ){
    const char *zByte = (const char *)sqlite3_value_text(apVal[0]);
    int nByte = sqlite3_value_bytes(apVal[0]);
    pCsr->zInput = sqlite3_malloc(nByte+1);
    if( pCsr->zInput==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memcpy(pCsr->zInput, zByte, nByte);
      pCsr->zInput[nByte] = 0;
      rc = pTab->pMod->xOpen(pTab->pTok, pCsr->zInput, nByte, &pCsr->pCsr);
      if( rc==SQLITE_OK ){
        pCsr->pCsr->pTokenizer = pTab->pTok;
      }
    }
  }

  if( rc!=SQLITE_OK ) return rc;
  return fts3tokNextMethod(pCursor);
}